

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O2

void __thiscall
google::protobuf::
Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>::Map
          (Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
           *this,Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
                 *other)

{
  const_iterator first;
  const_iterator last;
  const_iterator local_30;
  
  this->arena_ = (Arena *)0x0;
  this->default_enum_value_ = other->default_enum_value_;
  Init(this);
  begin(&local_30,other);
  first.it_.m_ = local_30.it_.m_;
  first.it_.node_ = local_30.it_.node_;
  first.it_.bucket_index_ = local_30.it_.bucket_index_;
  last.it_.bucket_index_ = 0;
  last.it_.node_ = (Node *)0x0;
  last.it_.m_ = (InnerMap *)0x0;
  Map<std::__cxx11::string,double>::
  insert<google::protobuf::Map<std::__cxx11::string,double>::const_iterator>
            ((Map<std::__cxx11::string,double> *)this,first,last);
  return;
}

Assistant:

Map(const Map& other)
      : arena_(NULL), default_enum_value_(other.default_enum_value_) {
    Init();
    insert(other.begin(), other.end());
  }